

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-data-getter-setters.c
# Opt level: O3

char * uv_req_type_name(uv_req_type type)

{
  if (type - UV_REQ < 10) {
    return &DAT_001a72e0 + *(int *)(&DAT_001a72e0 + (ulong)(type - UV_REQ) * 4);
  }
  return (char *)0x0;
}

Assistant:

const char* uv_req_type_name(uv_req_type type) {
  switch (type) {
#define XX(uc,lc) case UV_##uc: return #lc;
  UV_REQ_TYPE_MAP(XX)
#undef XX
  case UV_REQ_TYPE_MAX:
  case UV_UNKNOWN_REQ:
  default: /* UV_REQ_TYPE_PRIVATE */
    break;
  }
  return NULL;
}